

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_double(sqlite3_stmt *pStmt,int i,double rValue)

{
  int iVar1;
  double in_RDI;
  Vdbe *in_XMM0_Qa;
  Vdbe *p;
  int rc;
  uint in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = vdbeUnbind(in_XMM0_Qa,in_stack_ffffffffffffffe4);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetDouble((Mem *)(ulong)in_stack_ffffffffffffffe0,in_RDI);
    sqlite3_mutex_leave((sqlite3_mutex *)0x116a57);
  }
  return iVar1;
}

Assistant:

SQLITE_STDCALL sqlite3_bind_double(sqlite3_stmt *pStmt, int i, double rValue){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetDouble(&p->aVar[i-1], rValue);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}